

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int aead_do_encrypt(ptls_aead_context_t *_ctx,void *_output,size_t *outlen,void *input,size_t inlen,
                   void *iv,uint8_t enc_content_type)

{
  size_t sVar1;
  int iVar2;
  undefined8 in_RAX;
  int iVar3;
  int blocklen;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  *outlen = 0;
  iVar2 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)_ctx[1].algo,(EVP_CIPHER *)0x0,(ENGINE *)0x0,
                             (uchar *)0x0,(uchar *)iv);
  iVar3 = 0x203;
  if (iVar2 != 0) {
    iVar2 = EVP_EncryptUpdate((EVP_CIPHER_CTX *)_ctx[1].algo,(uchar *)_output,&local_34,
                              (uchar *)input,(int)inlen);
    if (iVar2 != 0) {
      sVar1 = *outlen;
      *outlen = (long)local_34 + sVar1;
      iVar2 = EVP_EncryptUpdate((EVP_CIPHER_CTX *)_ctx[1].algo,
                                (uchar *)((long)local_34 + sVar1 + (long)_output),&local_34,
                                &enc_content_type,1);
      if (iVar2 != 0) {
        sVar1 = *outlen;
        *outlen = (long)local_34 + sVar1;
        iVar2 = EVP_EncryptFinal_ex((EVP_CIPHER_CTX *)_ctx[1].algo,
                                    (uchar *)((long)local_34 + sVar1 + (long)_output),&local_34);
        if (iVar2 != 0) {
          sVar1 = *outlen;
          *outlen = (long)local_34 + sVar1;
          iVar2 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)_ctx[1].algo,0x10,(int)_ctx[1].seq,
                                      (void *)((long)_output + (long)local_34 + sVar1));
          if (iVar2 != 0) {
            *outlen = *outlen + _ctx[1].seq;
            iVar3 = 0;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int aead_do_encrypt(ptls_aead_context_t *_ctx, void *_output, size_t *outlen, const void *input, size_t inlen,
                           const void *iv, uint8_t enc_content_type)
{
    struct aead_crypto_context_t *ctx = (struct aead_crypto_context_t *)_ctx;
    uint8_t *output = _output;
    int blocklen;

    *outlen = 0;

    /* FIXME for performance, preserve the expanded key instead of the raw key */
    if (!EVP_EncryptInit_ex(ctx->evp_ctx, NULL, NULL, NULL, iv))
        return PTLS_ERROR_LIBRARY;
    if (!EVP_EncryptUpdate(ctx->evp_ctx, output, &blocklen, input, (int)inlen))
        return PTLS_ERROR_LIBRARY;
    *outlen += blocklen;
    if (!EVP_EncryptUpdate(ctx->evp_ctx, output + *outlen, &blocklen, &enc_content_type, 1))
        return PTLS_ERROR_LIBRARY;
    *outlen += blocklen;
    if (!EVP_EncryptFinal_ex(ctx->evp_ctx, output + *outlen, &blocklen))
        return PTLS_ERROR_LIBRARY;
    *outlen += blocklen;
    if (!EVP_CIPHER_CTX_ctrl(ctx->evp_ctx, EVP_CTRL_GCM_GET_TAG, (int)ctx->tag_size, output + *outlen))
        return PTLS_ERROR_LIBRARY;
    *outlen += ctx->tag_size;

    return 0;
}